

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O3

void booster::aio::details::add<booster::aio::const_buffer>(const_buffer *left,const_buffer *right)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  pointer peVar5;
  ulong uVar6;
  long lVar7;
  
  iVar1 = (right->super_buffer_impl<const_char_*>).size_;
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      peVar5 = &(right->super_buffer_impl<const_char_*>).entry_;
      uVar6 = 1;
    }
    else {
      peVar5 = (right->super_buffer_impl<const_char_*>).vec_.
               super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)(right->super_buffer_impl<const_char_*>).vec_.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)peVar5;
      if (lVar7 == 0) {
        return;
      }
      uVar6 = lVar7 >> 4;
    }
    uVar3 = 0;
    uVar4 = 1;
    do {
      buffer_impl<const_char_*>::add
                (&left->super_buffer_impl<const_char_*>,peVar5[uVar3].ptr,peVar5[uVar3].size);
      bVar2 = uVar4 < uVar6;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

std::pair<entry const *,size_t> get() const
			{
				if(size_ == 0) {
					buffer_data_type bt;
					bt.first=0;
					bt.second=0;
					return bt;
				}
				else if(size_ == 1)
					return buffer_data_type(&entry_,1);
				else
					return buffer_data_type(&vec_.front(),vec_.size());
			}